

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osal.c
# Opt level: O2

void osal_timer_start(osal_timert *self,uint32 timeout_usec)

{
  uint32 uVar1;
  long lVar2;
  undefined4 in_register_00000034;
  timeval start_time;
  timeval local_28;
  
  osal_gettimeofday(&local_28,(timezone *)CONCAT44(in_register_00000034,timeout_usec));
  lVar2 = (ulong)timeout_usec % 1000000 + local_28.tv_usec;
  uVar1 = (uint32)lVar2 - 1000000;
  if (lVar2 < 1000000) {
    uVar1 = (uint32)lVar2;
  }
  (self->stop_time).sec = (uint)(999999 < lVar2) + timeout_usec / 1000000 + (int)local_28.tv_sec;
  (self->stop_time).usec = uVar1;
  return;
}

Assistant:

void osal_timer_start (osal_timert * self, uint32 timeout_usec)
{
   struct timeval start_time;
   struct timeval timeout;
   struct timeval stop_time;

   osal_gettimeofday (&start_time, 0);
   timeout.tv_sec = timeout_usec / USECS_PER_SEC;
   timeout.tv_usec = timeout_usec % USECS_PER_SEC;
   timeradd (&start_time, &timeout, &stop_time);

   self->stop_time.sec = stop_time.tv_sec;
   self->stop_time.usec = stop_time.tv_usec;
}